

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::PushPopCommBuf::serialize(PushPopCommBuf *this,A2A *a2a)

{
  unsigned_long x;
  bool bVar1;
  pointer pPVar2;
  pointer puVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  Buffer nbuf;
  byte local_52 [10];
  long local_48;
  size_t local_40;
  unsigned_long local_38;
  
  local_48 = (long)(this->m_popped_slots).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_popped_slots).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  sVar4 = 0;
  uVar5 = (long)(this->m_pushed_slots).
                super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_pushed_slots).
                super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  do {
    uVar6 = uVar5 >> 7;
    local_52[sVar4] = (0x7f < uVar5) << 7 | (byte)uVar5 & 0x7f;
    sVar4 = sVar4 + 1;
    bVar1 = 0x7f < uVar5;
    uVar5 = uVar6;
  } while (bVar1);
  if (0 < a2a->m_nprocs) {
    iVar7 = 0;
    local_40 = sVar4;
    do {
      A2A::send(a2a,iVar7,local_52,local_40,(int)uVar6);
      pPVar2 = (this->m_pushed_slots).
               super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_pushed_slots).
          super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish != pPVar2) {
        lVar8 = 0;
        uVar5 = 0;
        do {
          x = *(unsigned_long *)((long)&(pPVar2->block).size + lVar8);
          local_38 = *(unsigned_long *)((long)&pPVar2->slot + lVar8);
          serial<unsigned_long>(a2a,iVar7,*(unsigned_long *)((long)&(pPVar2->block).addr + lVar8));
          serial<unsigned_long>(a2a,iVar7,x);
          serial<unsigned_long>(a2a,iVar7,local_38);
          uVar5 = uVar5 + 1;
          pPVar2 = (this->m_pushed_slots).
                   super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x20;
        } while (uVar5 < (ulong)((long)(this->m_pushed_slots).
                                       super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >>
                                5));
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < a2a->m_nprocs);
  }
  sVar4 = 0;
  uVar5 = local_48 >> 3;
  do {
    local_52[sVar4] = (0x7f < uVar5) << 7 | (byte)uVar5 & 0x7f;
    sVar4 = sVar4 + 1;
    bVar1 = 0x7f < uVar5;
    uVar5 = uVar5 >> 7;
  } while (bVar1);
  if (0 < a2a->m_nprocs) {
    iVar7 = 0;
    do {
      A2A::send(a2a,iVar7,local_52,sVar4,(int)uVar6);
      puVar3 = (this->m_popped_slots).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_popped_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        uVar5 = 0;
        do {
          serial<unsigned_long>(a2a,iVar7,puVar3[uVar5]);
          uVar5 = uVar5 + 1;
          puVar3 = (this->m_popped_slots).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)(this->m_popped_slots).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >>
                                3));
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < a2a->m_nprocs);
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::serialize( A2A & a2a ) 
{
    typedef UIntSerialize< size_t >    SizeSer;

    const size_t n_pushed_slots = m_pushed_slots.size();
    const size_t n_popped_slots = m_popped_slots.size();

    // broadcast pushed slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_pushed_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_pushed_slots.size(); ++s) {
            PushEntry entry = m_pushed_slots[s];
            char * null = NULL;
            size_t addr = static_cast<char *>(entry.block.addr) - null;
            size_t size = entry.block.size;
            size_t id = entry.slot;
            
            serial( a2a, p, addr );
            serial( a2a, p, size );
            serial( a2a, p, id );
        }
    } }

    // broadcast popped slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_popped_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_popped_slots.size(); ++s) {
            Memslot slotid = m_popped_slots[s];
            serial( a2a, p, slotid );
        }
    } }
}